

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLLinOp::setDomainBC
          (MLLinOp *this,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *a_lobc,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *a_hibc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *this_00;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pVVar4;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *pVVar5;
  Geometry *this_01;
  reference pvVar6;
  MLLinOp *in_RDI;
  int n;
  int hd;
  int idim;
  int icomp;
  int ncomp;
  char *in_stack_00000168;
  int in_stack_00000174;
  char *in_stack_00000178;
  char *in_stack_00000180;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *in_stack_ffffffffffffff48;
  int iVar7;
  int in_stack_ffffffffffffff64;
  int local_94;
  int local_90;
  
  iVar2 = (*in_RDI->_vptr_MLLinOp[5])();
  this_00 = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)(long)iVar2;
  iVar7 = iVar2;
  pVVar4 = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
           Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ::size((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   *)0x126dbbb);
  if (this_00 == pVVar4) {
    in_stack_ffffffffffffff48 =
         (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *)(long)iVar2;
    pVVar5 = (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                ::size((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)0x126dbdb);
    if (in_stack_ffffffffffffff48 == pVVar5) goto LAB_0126dc4b;
  }
  Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
LAB_0126dc4b:
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)this_00,in_stack_ffffffffffffff48);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)this_00,in_stack_ffffffffffffff48);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)this_00,in_stack_ffffffffffffff48);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)this_00,in_stack_ffffffffffffff48);
  local_90 = 0;
  do {
    if (iVar2 <= local_90) {
      bVar1 = hasHiddenDimension((MLLinOp *)0x126df7f);
      if (bVar1) {
        hiddenDirection(in_RDI);
        for (in_stack_ffffffffffffff64 = 0; in_stack_ffffffffffffff64 < iVar2;
            in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)this_00,(size_type)in_stack_ffffffffffffff48);
          pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)this_00,
                              (size_type)in_stack_ffffffffffffff48);
          *pvVar6 = Neumann;
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)this_00,(size_type)in_stack_ffffffffffffff48);
          pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)this_00,
                              (size_type)in_stack_ffffffffffffff48);
          *pvVar6 = Neumann;
        }
      }
      bVar1 = hasInhomogNeumannBC(in_RDI);
      if ((bVar1) && (uVar3 = (*in_RDI->_vptr_MLLinOp[0x41])(), (uVar3 & 1) == 0)) {
        Abort_host((char *)CONCAT44(in_stack_ffffffffffffff64,iVar7));
      }
      bVar1 = hasRobinBC(in_RDI);
      if ((bVar1) && (uVar3 = (*in_RDI->_vptr_MLLinOp[0x40])(), (uVar3 & 1) == 0)) {
        Abort_host((char *)CONCAT44(in_stack_ffffffffffffff64,iVar7));
      }
      return;
    }
    for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)this_00,(size_type)in_stack_ffffffffffffff48);
      this_01 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                          (this_00,(size_type)in_stack_ffffffffffffff48);
      bVar1 = Geometry::isPeriodic(this_01,local_94);
      if (bVar1) {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)this_00,(size_type)in_stack_ffffffffffffff48);
        pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)this_00,
                            (size_type)in_stack_ffffffffffffff48);
        if (*pvVar6 == Periodic) {
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)this_00,(size_type)in_stack_ffffffffffffff48);
          pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)this_00,
                              (size_type)in_stack_ffffffffffffff48);
          if (*pvVar6 == Periodic) goto LAB_0126de5f;
        }
        Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
      }
      else {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)this_00,(size_type)in_stack_ffffffffffffff48);
        pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)this_00,
                            (size_type)in_stack_ffffffffffffff48);
        if (*pvVar6 != Periodic) {
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)this_00,(size_type)in_stack_ffffffffffffff48);
          pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)this_00,
                              (size_type)in_stack_ffffffffffffff48);
          if (*pvVar6 != Periodic) goto LAB_0126de5f;
        }
        Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
      }
LAB_0126de5f:
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)this_00,(size_type)in_stack_ffffffffffffff48);
      pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)this_00,
                          (size_type)in_stack_ffffffffffffff48);
      if (*pvVar6 == inhomogNeumann) {
LAB_0126deaf:
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)this_00,(size_type)in_stack_ffffffffffffff48);
        pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)this_00,
                            (size_type)in_stack_ffffffffffffff48);
        *pvVar6 = Neumann;
      }
      else {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)this_00,(size_type)in_stack_ffffffffffffff48);
        pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)this_00,
                            (size_type)in_stack_ffffffffffffff48);
        if (*pvVar6 == Robin) goto LAB_0126deaf;
      }
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)this_00,(size_type)in_stack_ffffffffffffff48);
      pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)this_00,
                          (size_type)in_stack_ffffffffffffff48);
      if (*pvVar6 == inhomogNeumann) {
LAB_0126df28:
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)this_00,(size_type)in_stack_ffffffffffffff48);
        pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)this_00,
                            (size_type)in_stack_ffffffffffffff48);
        *pvVar6 = Neumann;
      }
      else {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)this_00,(size_type)in_stack_ffffffffffffff48);
        pvVar6 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)this_00,
                            (size_type)in_stack_ffffffffffffff48);
        if (*pvVar6 == Robin) goto LAB_0126df28;
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void
MLLinOp::setDomainBC (const Vector<Array<BCType,AMREX_SPACEDIM> >& a_lobc,
                      const Vector<Array<BCType,AMREX_SPACEDIM> >& a_hibc) noexcept
{
    const int ncomp = getNComp();
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(ncomp == a_lobc.size() && ncomp == a_hibc.size(),
                                     "MLLinOp::setDomainBC: wrong size");
    m_lobc = a_lobc;
    m_hibc = a_hibc;
    m_lobc_orig = m_lobc;
    m_hibc_orig = m_hibc;
    for (int icomp = 0; icomp < ncomp; ++icomp) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (m_geom[0][0].isPeriodic(idim)) {
                AMREX_ALWAYS_ASSERT(m_lobc[icomp][idim] == BCType::Periodic &&
                                    m_hibc[icomp][idim] == BCType::Periodic);
            } else {
                AMREX_ALWAYS_ASSERT(m_lobc[icomp][idim] != BCType::Periodic &&
                                    m_hibc[icomp][idim] != BCType::Periodic);
            }

            if (m_lobc[icomp][idim] == LinOpBCType::inhomogNeumann ||
                m_lobc[icomp][idim] == LinOpBCType::Robin)
            {
                m_lobc[icomp][idim] = LinOpBCType::Neumann;
            }

            if (m_hibc[icomp][idim] == LinOpBCType::inhomogNeumann ||
                m_hibc[icomp][idim] == LinOpBCType::Robin)
            {
                m_hibc[icomp][idim] = LinOpBCType::Neumann;
            }
        }
    }

    if (hasHiddenDimension()) {
        const int hd = hiddenDirection();
        for (int n = 0; n < ncomp; ++n) {
            m_lobc[n][hd] = LinOpBCType::Neumann;
            m_hibc[n][hd] = LinOpBCType::Neumann;
        }
    }

    if (hasInhomogNeumannBC() && !supportInhomogNeumannBC()) {
        amrex::Abort("Inhomogeneous Neumann BC not supported");
    }
    if (hasRobinBC() && !supportRobinBC()) {
        amrex::Abort("Robin BC not supported");
    }
}